

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  Schema SVar1;
  undefined4 uVar2;
  char cVar3;
  unsigned_long uVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StructSchema schema;
  DebugComparison<capnp::Schema,_capnp::EnumSchema> _kjCondition_1;
  undefined1 local_a30;
  Fault f_1;
  uint local_898;
  uint local_894;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_10;
  Field lookup;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  uint uStack_7f0;
  Field field;
  unsigned_long local_4e0 [150];
  
  schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)&_kjCondition_1,&schema.super_Schema);
  if ((uint)_kjCondition_1._32_4_ < 0x40) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right = *(unsigned_long *)_kjCondition_1.op.content.ptr;
  }
  _kjCondition.left = 0xa0a8f314b80b63fd;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0xa0a8f314b80b63fd;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    field.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0xa0a8f314b80b63fd;
    Schema::getProto((Reader *)&_kjCondition_1,&schema.super_Schema);
    if ((uint)_kjCondition_1._32_4_ < 0x40) {
      local_4e0[0] = 0;
    }
    else {
      local_4e0[0] = *(unsigned_long *)_kjCondition_1.op.content.ptr;
    }
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", _kjCondition, typeId<TestAllTypes>(), schema.getProto().getId()"
               ,(char (*) [73])
                "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
               &_kjCondition,(unsigned_long *)&field,local_4e0);
  }
  _kjCondition_1.left = Schema::getDependency((Schema *)&schema,0x9c8e9318b29d9cd3,0);
  _kjCondition_1.right.super_Schema.raw = (Schema)((long)schemas::s_9c8e9318b29d9cd3 + 0x48);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  bVar7 = _kjCondition_1.left.raw == (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  _kjCondition_1.result = bVar7;
  if ((!bVar7) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[86],kj::_::DebugComparison<capnp::Schema,capnp::EnumSchema>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2e,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\", _kjCondition"
               ,(char (*) [86])
                "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
               ,&_kjCondition_1);
  }
  _kjCondition_1.left = Schema::getDependency((Schema *)&schema,0x9c8e9318b29d9cd3,0);
  _kjCondition_1.op.content.ptr = " != ";
  _kjCondition_1.result = (Schema)_kjCondition_1.left.raw != schema.super_Schema.raw;
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.right.super_Schema.raw = (Schema)(RawBrandedSchema *)&schema;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\", _kjCondition"
               ,(char (*) [68])"failed: expected schema.getDependency(typeId<TestEnum>()) != schema"
               ,(DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)&_kjCondition_1);
  }
  _kjCondition_1.left = Schema::getDependency((Schema *)&schema,0xa0a8f314b80b63fd,0);
  _kjCondition_1.right.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result =
       _kjCondition_1.left.raw == (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[94],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\", _kjCondition"
               ,(char (*) [94])
                "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
               ,(DebugComparison<capnp::Schema,_capnp::StructSchema> *)&_kjCondition_1);
  }
  _kjCondition_1.left = Schema::getDependency((Schema *)&schema,0xa0a8f314b80b63fd,0);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = (Schema)_kjCondition_1.left.raw == schema.super_Schema.raw;
  _kjCondition_1.right.super_Schema.raw = (Schema)(RawBrandedSchema *)&schema;
  if (((Schema)_kjCondition_1.left.raw != schema.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\", _kjCondition"
               ,(char (*) [72])
                "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema",
               (DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)&_kjCondition_1);
  }
  Schema::getDependency((Schema *)&schema,0xeb3f9ebe98c73cb6,0);
  field.parent.super_Schema.raw =
       (Schema)((ulong)field.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&field);
  cVar3 = (byte)_kjCondition.left;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition_1,(Maybe<kj::Exception> *)&_kjCondition);
  if ((byte)_kjCondition.left == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition.right);
  }
  if ((char)field.parent.super_Schema.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&field.index);
  }
  if ((cVar3 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[112],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != kj::none\", _kjCondition"
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition_1);
  }
  if ((char)_kjCondition_1.left.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition_1.right);
  }
  _kjCondition_1.left.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&schema);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = (Schema)_kjCondition_1.left.raw == schema.super_Schema.raw;
  _kjCondition_1.right.super_Schema.raw = (Schema)(RawBrandedSchema *)&schema;
  if (((Schema)_kjCondition_1.left.raw != schema.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[45],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\", _kjCondition",
               (char (*) [45])"failed: expected schema.asStruct() == schema",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)&_kjCondition_1);
  }
  Schema::asEnum(&schema.super_Schema);
  field.parent.super_Schema.raw =
       (Schema)((ulong)field.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&field);
  cVar3 = (byte)_kjCondition.left;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition_1,(Maybe<kj::Exception> *)&_kjCondition);
  if ((byte)_kjCondition.left == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition.right);
  }
  if ((char)field.parent.super_Schema.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&field.index);
  }
  if ((cVar3 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != kj::none\", _kjCondition"
               ,(char (*) [83])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition_1);
  }
  if ((char)_kjCondition_1.left.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition_1.right);
  }
  Schema::asInterface(&schema.super_Schema);
  field.parent.super_Schema.raw =
       (Schema)((ulong)field.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&field);
  cVar3 = (byte)_kjCondition.left;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition_1,(Maybe<kj::Exception> *)&_kjCondition);
  if ((byte)_kjCondition.left == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition.right);
  }
  if ((char)field.parent.super_Schema.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&field.index);
  }
  if ((cVar3 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none\", _kjCondition"
               ,(char (*) [88])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition_1);
  }
  if ((char)_kjCondition_1.left.raw == '\x01') {
    kj::Exception::~Exception((Exception *)&_kjCondition_1.right);
  }
  field.parent.super_Schema.raw = (Schema)((long)"TextCodec TestAllTypes" + 10);
  _kjCondition._0_16_ = Schema::getUnqualifiedName(&schema.super_Schema);
  kj::_::DebugExpression<char_const(&)[13]>::operator==
            ((DebugComparison<const_char_(&)[13],_const_kj::StringPtr> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[13]> *)&field,(StringPtr *)&_kjCondition);
  if (local_a30 == '\0') {
    _kjCondition._0_16_ = Schema::getUnqualifiedName(&schema.super_Schema);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<char_const(&)[13],kj::StringPtr_const>&,char_const(&)[13],kj::StringPtr_const>
              ((Fault *)&field,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x37,FAILED,"(\"TestAllTypes\") == (schema.getUnqualifiedName())",
               "_kjCondition,\"TestAllTypes\", schema.getUnqualifiedName()",
               (DebugComparison<const_char_(&)[13],_const_kj::StringPtr> *)&_kjCondition_1,
               (char (*) [13])0x5029cd,(StringPtr *)&_kjCondition);
    kj::_::Debug::Fault::fatal((Fault *)&field);
  }
  StructSchema::getFields((FieldList *)&_kjCondition_1,(StructSchema *)&schema.super_Schema);
  uVar2 = _kjCondition_1._32_4_;
  Schema::getProto((Reader *)&field,&schema.super_Schema);
  lookup.proto._reader.segment = (SegmentReader *)(field.proto._reader.capTable + 3);
  if (field.proto._reader.data._4_2_ < 4) {
    lookup.proto._reader.segment = (SegmentReader *)0x0;
  }
  if (field.proto._reader.data._4_2_ < 4) {
    lookup.parent.super_Schema.raw._0_4_ = 0;
    lookup.parent.super_Schema.raw._4_4_ = 0;
    lookup.index = 0;
    lookup._12_4_ = 0;
    lookup.proto._reader.capTable._0_4_ = 0x7fffffff;
  }
  else {
    lookup.parent.super_Schema.raw._0_4_ = field.parent.super_Schema.raw._0_4_;
    lookup.parent.super_Schema.raw._4_4_ = field.parent.super_Schema.raw._4_4_;
    lookup.index = field.index;
    lookup._12_4_ = field._12_4_;
    lookup.proto._reader.capTable._0_4_ = field.proto._reader.pointers._0_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&lookup,INLINE_COMPOSITE,(word *)0x0);
  _kjCondition_10.left = uVar2;
  _kjCondition_10.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_10.op.content.ptr = " == ";
  _kjCondition_10.op.content.size_ = 5;
  _kjCondition_10.result = uVar2 == (uint)_kjCondition.op.content.size_;
  if (!_kjCondition_10.result) {
    StructSchema::getFields((FieldList *)&_kjCondition_1,(StructSchema *)&schema.super_Schema);
    local_894 = _kjCondition_1._32_4_;
    Schema::getProto((Reader *)&lookup,&schema.super_Schema);
    field._12_4_ = lookup._12_4_;
    field.index = lookup.index;
    field.proto._reader.capTable =
         (CapTableReader *)
         CONCAT44(lookup.proto._reader.capTable._4_4_,lookup.proto._reader.capTable._0_4_);
    field.proto._reader.data = lookup.proto._reader.data;
    field.proto._reader.pointers = lookup.proto._reader.pointers;
    field.proto._reader.segment = lookup.proto._reader.segment;
    field.parent = lookup.parent;
    capnp::schema::Node::Struct::Reader::getFields((Reader *)&_kjCondition,(Reader *)&field);
    local_898 = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x39,FAILED,
               "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
               "_kjCondition,schema.getFields().size(), schema.getProto().getStruct().getFields().size()"
               ,&_kjCondition_10,&local_894,&local_898);
    kj::_::Debug::Fault::fatal(&f_1);
  }
  StructSchema::getFields((FieldList *)&_kjCondition_1,&schema);
  SVar1 = _kjCondition_1.left;
  ListReader::getStructElement(&field.proto._reader,(ListReader *)&_kjCondition_1.right,0);
  field.parent.super_Schema.raw = (Schema)(Schema)SVar1.raw;
  field._8_8_ = (ulong)(uint)field._12_4_ << 0x20;
  lookup.parent.super_Schema.raw = (Schema)anon_var_dwarf_1272de;
  bVar7 = field.proto._reader.pointerCount == 0;
  _kjCondition_1.op.content.ptr = (char *)field.proto._reader.pointers;
  if (bVar7) {
    _kjCondition_1.op.content.ptr = (char *)(WirePointer *)0x0;
  }
  iVar6 = 0x7fffffff;
  if (!bVar7) {
    iVar6 = field.proto._reader.nestingLimit;
  }
  _kjCondition_1.left.raw._0_4_ = 0;
  _kjCondition_1.left.raw._4_4_ = 0;
  _kjCondition_1.right.super_Schema.raw._0_4_ = 0;
  _kjCondition_1.right.super_Schema.raw._4_4_ = 0;
  if (!bVar7) {
    _kjCondition_1.left.raw._0_4_ = field.proto._reader.segment._0_4_;
    _kjCondition_1.left.raw._4_4_ = field.proto._reader.segment._4_4_;
    _kjCondition_1.right.super_Schema.raw._0_4_ = field.proto._reader.capTable._0_4_;
    _kjCondition_1.right.super_Schema.raw._4_4_ = field.proto._reader.capTable._4_4_;
  }
  _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar6);
  _kjCondition._0_16_ =
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[10]>::operator==
            ((DebugComparison<const_char_(&)[10],_capnp::Text::Reader> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[10]> *)&lookup,(Reader *)&_kjCondition);
  if (kj::_::Debug::minSeverity < 3 && local_a30 == '\0') {
    bVar7 = field.proto._reader.pointerCount == 0;
    _kjCondition.op.content.ptr = (char *)field.proto._reader.pointers;
    if (bVar7) {
      _kjCondition.op.content.ptr = (char *)(WirePointer *)0x0;
    }
    iVar6 = 0x7fffffff;
    if (!bVar7) {
      iVar6 = field.proto._reader.nestingLimit;
    }
    _kjCondition.left._0_4_ = 0;
    _kjCondition.left._4_4_ = 0;
    _kjCondition.right._0_4_ = 0;
    _kjCondition.right._4_4_ = 0;
    if (!bVar7) {
      _kjCondition.left._0_4_ = field.proto._reader.segment._0_4_;
      _kjCondition.left._4_4_ = field.proto._reader.segment._4_4_;
      _kjCondition.right._0_4_ = field.proto._reader.capTable._0_4_;
      _kjCondition.right._4_4_ = field.proto._reader.capTable._4_4_;
    }
    _kjCondition.op.content.size_ = CONCAT44(_kjCondition.op.content.size_._4_4_,iVar6);
    _kjCondition._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[10],capnp::Text::Reader>&,char_const(&)[10],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3b,ERROR,
               "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", _kjCondition, \"voidField\", field.getProto().getName()"
               ,(char (*) [63])"failed: expected (\"voidField\") == (field.getProto().getName())",
               (DebugComparison<const_char_(&)[10],_capnp::Text::Reader> *)&_kjCondition_1,
               (char (*) [10])"voidField",(Reader *)&_kjCondition);
  }
  _kjCondition_1.left = field.parent.super_Schema.raw;
  _kjCondition_1.right.super_Schema.raw = (Schema)&schema;
  _kjCondition_1.op.content.ptr = " == ";
  bVar7 = field.parent.super_Schema.raw == schema.super_Schema.raw;
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = bVar7;
  if ((!bVar7) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3c,ERROR,
               "\"failed: expected \" \"field.getContainingStruct() == schema\", _kjCondition",
               (char (*) [55])"failed: expected field.getContainingStruct() == schema",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)&_kjCondition_1);
  }
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  StructSchema::getFieldByName(&lookup,&schema,name);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result =
       lookup.index == field.index &&
       lookup.parent.super_Schema.raw == field.parent.super_Schema.raw;
  _kjCondition_1.left.raw = (RawBrandedSchema *)&lookup;
  _kjCondition_1.right.super_Schema.raw = (Schema)(RawBrandedSchema *)&field;
  if ((lookup.index != field.index ||
       lookup.parent.super_Schema.raw != field.parent.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[33],kj::_::DebugComparison<capnp::StructSchema::Field&,capnp::StructSchema::Field&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"lookup == field\", _kjCondition",
               (char (*) [33])"failed: expected lookup == field",
               (DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field_&> *)
               &_kjCondition_1);
  }
  StructSchema::getFields((FieldList *)&_kjCondition_10,&schema);
  SVar1.raw._4_4_ = _kjCondition_10.right;
  SVar1.raw._0_4_ = _kjCondition_10.left;
  ListReader::getStructElement((StructReader *)&_kjCondition.op,(ListReader *)&_kjCondition_10.op,1)
  ;
  _kjCondition.right._0_4_ = 1;
  _kjCondition.left = (unsigned_long)SVar1.raw;
  _kjCondition_1.op.content.size_ = (size_t)_kjCondition.op.content.ptr;
  _kjCondition_1._32_8_ = _kjCondition.op.content.size_;
  _kjCondition_1.op.content.ptr = (char *)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition_1.left.raw = (RawBrandedSchema *)&lookup;
  _kjCondition_1.right.super_Schema.raw = (Schema)(Schema)SVar1.raw;
  if ((lookup.index == 1 && lookup.parent.super_Schema.raw == (Schema)SVar1.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<capnp::StructSchema::Field&,capnp::StructSchema::Field>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"lookup != schema.getFields()[1]\", _kjCondition"
               ,(char (*) [49])"failed: expected lookup != schema.getFields()[1]",
               (DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field> *)
               &_kjCondition_1);
  }
  if (0x80 < lookup.proto._reader.dataSize) {
    _kjCondition_1.left.raw =
         (RawBrandedSchema *)
         (CONCAT71(_kjCondition_1.left.raw._1_7_,*(byte *)((long)lookup.proto._reader.data + 0x10))
          & 0xffffffffffffff01 ^ 1);
    if (((*(byte *)((long)lookup.proto._reader.data + 0x10) & 1) != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x41,ERROR,
                 "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\", _kjCondition"
                 ,(char (*) [72])
                  "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())",
                 (DebugExpression<bool> *)&_kjCondition_1);
    }
  }
  name_00.content.size_ = 0xb;
  name_00.content.ptr = "int32Field";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name_00);
  uVar4 = _kjCondition.right;
  if (0x80 < uStack_7f0) {
    bVar5 = *(byte *)(_kjCondition_1._32_8_ + 0x10) & 1;
    _kjCondition.left._0_1_ = bVar5 ^ 1;
    if ((bVar5 != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\", _kjCondition"
                 ,(char (*) [101])
                  "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
                 ,(DebugExpression<bool> *)&_kjCondition);
      uVar4 = _kjCondition.right;
    }
  }
  _kjCondition.right = uVar4;
  _kjCondition.left = 0x6bf1f8;
  name_01.content.size_ = 0xb;
  name_01.content.ptr = "int32Field";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,(StructSchema *)&_kjCondition,name_01);
  if (uStack_7f0 < 0x81) {
    _kjCondition_10.left = (uint)_kjCondition_10.left._1_3_ << 8;
  }
  else {
    _kjCondition_10.left =
         CONCAT31(_kjCondition_10.left._1_3_,*(byte *)(_kjCondition_1._32_8_ + 0x10)) & 0xffffff01;
    if ((*(byte *)(_kjCondition_1._32_8_ + 0x10) & 1) != 0) goto LAB_001b32d6;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[121],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\", _kjCondition"
               ,(char (*) [121])
                "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
               ,(DebugExpression<bool> *)&_kjCondition_10);
  }
LAB_001b32d6:
  name_02.content.size_ = 0xc;
  name_02.content.ptr = "noSuchField";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_02);
  if ((byte)_kjCondition.left == '\x01') {
    _kjCondition_1._33_7_ = _kjCondition._33_7_;
    _kjCondition_1.result = _kjCondition.result;
    _kjCondition_1.op.content.size_ = _kjCondition.op.content.size_;
    _kjCondition_1.right.super_Schema.raw = (Schema)(Schema)_kjCondition.right;
    _kjCondition_1.op.content.ptr = _kjCondition.op.content.ptr;
  }
  _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
  if (((byte)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x48,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == kj::none\", _kjCondition"
               ,(char (*) [67])
                "failed: expected schema.findFieldByName(\"noSuchField\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_03.content.size_ = 0xb;
  name_03.content.ptr = "int32Field";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_03);
  if ((byte)_kjCondition.left != '\x01') {
    _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::
      log<char_const(&)[66],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != kj::none\", _kjCondition"
                 ,(char (*) [66])
                  "failed: expected schema.findFieldByName(\"int32Field\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
  }
  name_04.content.size_ = 0xc;
  name_04.content.ptr = "float32List";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_04);
  if ((byte)_kjCondition.left != '\x01') {
    _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != kj::none\", _kjCondition"
                 ,(char (*) [67])
                  "failed: expected schema.findFieldByName(\"float32List\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
  }
  name_05.content.size_ = 9;
  name_05.content.ptr = "dataList";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_05);
  if ((byte)_kjCondition.left != '\x01') {
    _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != kj::none\", _kjCondition"
                 ,(char (*) [64])"failed: expected schema.findFieldByName(\"dataList\") != kj::none"
                 ,(DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                  &_kjCondition_1);
    }
  }
  name_06.content.size_ = 10;
  name_06.content.ptr = "textField";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_06);
  if ((byte)_kjCondition.left != '\x01') {
    _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4d,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != kj::none\", _kjCondition"
                 ,(char (*) [65])
                  "failed: expected schema.findFieldByName(\"textField\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
  }
  name_07.content.size_ = 0xc;
  name_07.content.ptr = "structField";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_07);
  if ((byte)_kjCondition.left != '\x01') {
    _kjCondition_1.left.raw._0_1_ = (byte)_kjCondition.left;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4e,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != kj::none\", _kjCondition"
                 ,(char (*) [67])
                  "failed: expected schema.findFieldByName(\"structField\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
  }
  return;
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());
  ASSERT_EQ("TestAllTypes", schema.getUnqualifiedName());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("float32List") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("dataList") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("textField") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("structField") != kj::none);
}